

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BatchKmersCounter.cc
# Opt level: O1

shared_ptr<KmerList> __thiscall
BatchKmersCounter::kmerCountOMPDiskBased
          (BatchKmersCounter *this,uint8_t K,LongReadsDatastore *reads,uint minCount,string *tmpdir,
          string *workdir,uchar disk_batches)

{
  size_type *psVar1;
  size_type *psVar2;
  uint64_t *puVar3;
  size_type *psVar4;
  ulong *puVar5;
  ulong *puVar6;
  size_type sVar7;
  shared_ptr<KmerList> *psVar8;
  KMerNodeFreq_s *pKVar9;
  _func_int *p_Var10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ostream *poVar17;
  undefined8 *puVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  KmerList *this_00;
  ulong uVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  int i;
  pointer pcVar24;
  uint uVar25;
  ulong uVar26;
  ulong *puVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  string *psVar31;
  long *plVar32;
  shared_ptr<KmerList> sVar33;
  ulong uStack_b10;
  size_type *local_b08;
  uint64_t hist [256];
  size_type *local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  ios_base local_208 [264];
  long *local_100;
  shared_ptr<KmerList> kmer_list;
  ulong local_c8;
  ulong local_c0;
  size_type *local_98;
  string __str;
  shared_ptr<KmerList> *kmerlist;
  size_type *local_68;
  string __str_2;
  
  uVar30 = (uint)disk_batches;
  uStack_b10 = 0x1d5fa8;
  __str.field_2._8_8_ = this;
  poVar17 = sdglib::OutputLog(INFO,true);
  uStack_b10 = 0x1d5fbf;
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"disk-based kmer counting with ",0x1e);
  uStack_b10 = 0x1d5fca;
  poVar17 = (ostream *)std::ostream::operator<<(poVar17,uVar30);
  uStack_b10 = 0x1d5fe1;
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," batches",8);
  uStack_b10 = 0x1d5ff5;
  std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
  uStack_b10 = 0x1d6000;
  std::ostream::put((char)poVar17);
  uStack_b10 = 0x1d6008;
  std::ostream::flush();
  uVar12 = __str_2.field_2._8_8_;
  uVar11 = _setbuf;
  psVar4 = _VTT;
  uVar26 = (ulong)uVar30;
  if (uVar30 != 0) {
    __str_2.field_2._9_3_ = 0;
    __str_2.field_2._M_local_buf[8] = K;
    __str_2.field_2._12_4_ = SUB84(uVar12,4);
    uVar20 = 0;
    do {
      uVar21 = uVar20 + 1;
      lVar19 = ((long)(reads->read_to_fileRecord).
                      super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(reads->read_to_fileRecord).
                      super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                      super__Vector_impl_data._M_start >> 4) + -1;
      uStack_b10 = 0x1d6088;
      kmerCountOMP((BatchKmersCounter *)&local_100,(uint8_t)__str_2.field_2._8_8_,reads,
                   (lVar19 * uVar20) / uVar26,(lVar19 * uVar21) / uVar26,0);
      psVar1 = &__str_2._M_string_length;
      pcVar24 = (tmpdir->_M_dataplus)._M_p;
      uStack_b10 = 0x1d60ad;
      local_68 = psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar24,pcVar24 + tmpdir->_M_string_length);
      uStack_b10 = 0x1d60bc;
      std::__cxx11::string::append((char *)&local_68);
      uVar25 = 1;
      uVar15 = (uint)uVar20;
      if (9 < uVar20) {
        uVar13 = 4;
        do {
          uVar25 = uVar13;
          uVar14 = (uint)uVar20;
          if (uVar14 < 100) {
            uVar25 = uVar25 - 2;
            goto LAB_001d610f;
          }
          if (uVar14 < 1000) {
            uVar25 = uVar25 - 1;
            goto LAB_001d610f;
          }
          if (uVar14 < 10000) goto LAB_001d610f;
          uVar20 = (uVar20 & 0xffffffff) / 10000;
          uVar13 = uVar25 + 4;
        } while (99999 < uVar14);
        uVar25 = uVar25 + 1;
      }
LAB_001d610f:
      local_98 = &__str._M_string_length;
      uStack_b10 = 0x1d612e;
      std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar25);
      uStack_b10 = 0x1d6140;
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,uVar25,uVar15);
      pcVar24 = (pointer)0xf;
      if (local_68 != psVar1) {
        pcVar24 = (pointer)__str_2._M_string_length;
      }
      if (pcVar24 < __str._M_dataplus._M_p + __str_2._M_dataplus._M_p) {
        pcVar24 = (pointer)0xf;
        if (local_98 != &__str._M_string_length) {
          pcVar24 = (pointer)__str._M_string_length;
        }
        if (pcVar24 < __str._M_dataplus._M_p + __str_2._M_dataplus._M_p) goto LAB_001d6181;
        uStack_b10 = 0x1d61a3;
        puVar18 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_68);
      }
      else {
LAB_001d6181:
        uStack_b10 = 0x1d6191;
        puVar18 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_98);
      }
      local_300 = &__str_1._M_string_length;
      psVar2 = puVar18 + 2;
      if ((size_type *)*puVar18 == psVar2) {
        __str_1._M_string_length = *psVar2;
        __str_1.field_2._M_allocated_capacity = puVar18[3];
      }
      else {
        __str_1._M_string_length = *psVar2;
        local_300 = (size_type *)*puVar18;
      }
      __str_1._M_dataplus._M_p = (pointer)puVar18[1];
      *puVar18 = psVar2;
      puVar18[1] = 0;
      *(undefined1 *)psVar2 = 0;
      uStack_b10 = 0x1d620d;
      std::ofstream::ofstream(&local_b08,(string *)&local_300,_S_trunc|_S_out|_S_bin);
      if (local_300 != &__str_1._M_string_length) {
        uStack_b10 = 0x1d622f;
        operator_delete(local_300,__str_1._M_string_length + 1);
      }
      if (local_98 != &__str._M_string_length) {
        uStack_b10 = 0x1d624b;
        operator_delete(local_98,__str._M_string_length + 1);
      }
      if (local_68 != psVar1) {
        uStack_b10 = 0x1d6260;
        operator_delete(local_68,__str_2._M_string_length + 1);
      }
      uStack_b10 = 0x1d6285;
      std::ostream::write((char *)&local_b08,*local_100);
      uStack_b10 = 0x1d6291;
      std::ofstream::close();
      uStack_b10 = 0x1d629d;
      poVar17 = sdglib::OutputLog(INFO,true);
      uStack_b10 = 0x1d62b4;
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"batch ",6);
      uStack_b10 = 0x1d62bf;
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,uVar15);
      uStack_b10 = 0x1d62d6;
      std::__ostream_insert<char,std::char_traits<char>>(poVar17," done and dumped with ",0x16);
      uStack_b10 = 0x1d62e2;
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      uStack_b10 = 0x1d62f9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar17," kmers",6);
      uStack_b10 = 0x1d630d;
      std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
      uStack_b10 = 0x1d6318;
      std::ostream::put((char)poVar17);
      uStack_b10 = 0x1d6320;
      std::ostream::flush();
      local_b08 = psVar4;
      *(undefined8 *)((long)hist + psVar4[-3] + -8) = uVar11;
      uStack_b10 = 0x1d634d;
      std::filebuf::~filebuf((filebuf *)hist);
      uStack_b10 = 0x1d6359;
      std::ios_base::~ios_base((ios_base *)(hist + 0x1e));
      if (kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        uStack_b10 = 0x1d636a;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      uVar20 = uVar21;
    } while (uVar21 != uVar26);
  }
  uStack_b10 = 0x1d6386;
  poVar17 = sdglib::OutputLog(INFO,true);
  uStack_b10 = 0x1d639d;
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"merging from disk",0x11);
  uStack_b10 = 0x1d63b1;
  std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
  uStack_b10 = 0x1d63bc;
  std::ostream::put((char)poVar17);
  uStack_b10 = 0x1d63c4;
  std::ostream::flush();
  lVar19 = -(ulong)(uVar30 * 0x208 + 0xf & 0xfffffff0);
  lVar29 = (long)hist + lVar19 + -8;
  if (disk_batches != '\0') {
    lVar28 = 0;
    do {
      *(undefined8 *)((long)&uStack_b10 + lVar19) = 0x1d63fb;
      std::ifstream::ifstream((void *)(lVar29 + lVar28));
      lVar28 = lVar28 + 0x208;
    } while ((ulong)disk_batches * 0x200 + uVar26 * 8 != lVar28);
  }
  __str_2.field_2._8_8_ = lVar29;
  lVar29 = lVar29 - (ulong)(uVar30 + 0xf & 0xfffffff0);
  puVar27 = (ulong *)(lVar29 - (ulong)(uVar30 * 0x11 + 0xf & 0xfffffff0));
  if (disk_batches != '\0') {
    uVar20 = 0;
    do {
      local_300 = &__str_1._M_string_length;
      pcVar24 = (tmpdir->_M_dataplus)._M_p;
      sVar7 = tmpdir->_M_string_length;
      puVar27[-1] = 0x1d6475;
      std::__cxx11::string::_M_construct<char*>((string *)&local_300,pcVar24,pcVar24 + sVar7);
      puVar27[-1] = 0x1d6484;
      std::__cxx11::string::append((char *)&local_300);
      uVar30 = 1;
      if (9 < uVar20) {
        uVar25 = 4;
        uVar21 = uVar20;
        do {
          uVar30 = uVar25;
          uVar15 = (uint)uVar21;
          if (uVar15 < 100) {
            uVar30 = uVar30 - 2;
            goto LAB_001d64d6;
          }
          if (uVar15 < 1000) {
            uVar30 = uVar30 - 1;
            goto LAB_001d64d6;
          }
          if (uVar15 < 10000) goto LAB_001d64d6;
          uVar21 = (uVar21 & 0xffffffff) / 10000;
          uVar25 = uVar30 + 4;
        } while (99999 < uVar15);
        uVar30 = uVar30 + 1;
      }
LAB_001d64d6:
      local_68 = &__str_2._M_string_length;
      puVar27[-1] = 0x1d64ef;
      std::__cxx11::string::_M_construct((ulong)&local_68,(char)uVar30);
      psVar4 = local_68;
      puVar27[-1] = 0x1d64fd;
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)psVar4,uVar30,(uint)uVar20);
      psVar1 = local_68;
      psVar4 = local_300;
      pcVar24 = (pointer)0xf;
      if (local_300 != &__str_1._M_string_length) {
        pcVar24 = (pointer)__str_1._M_string_length;
      }
      if (pcVar24 < __str_2._M_dataplus._M_p + __str_1._M_dataplus._M_p) {
        pcVar24 = (pointer)0xf;
        if (local_68 != &__str_2._M_string_length) {
          pcVar24 = (pointer)__str_2._M_string_length;
        }
        if (pcVar24 < __str_2._M_dataplus._M_p + __str_1._M_dataplus._M_p) goto LAB_001d654b;
        puVar27[-1] = 0x1d656a;
        puVar18 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)psVar4);
      }
      else {
LAB_001d654b:
        puVar27[-1] = 0x1d655b;
        puVar18 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)psVar1);
      }
      puVar3 = puVar18 + 2;
      if ((size_type *)*puVar18 == puVar3) {
        hist[1] = *puVar3;
        hist[2] = puVar18[3];
        local_b08 = hist + 1;
      }
      else {
        hist[1] = *puVar3;
        local_b08 = (size_type *)*puVar18;
      }
      hist[0] = puVar18[1];
      *puVar18 = puVar3;
      psVar31 = (string *)(uVar20 * 0x208 + __str_2.field_2._8_8_);
      puVar18[1] = 0;
      *(undefined1 *)puVar3 = 0;
      puVar27[-1] = 0x1d65d9;
      std::ifstream::open(psVar31,(_Ios_Openmode)&local_b08);
      psVar4 = local_b08;
      if (local_b08 != hist + 1) {
        uVar21 = hist[1] + 1;
        puVar27[-1] = 0x1d65f4;
        operator_delete(psVar4,uVar21);
      }
      psVar4 = local_68;
      if (local_68 != &__str_2._M_string_length) {
        uVar21 = __str_2._M_string_length + 1;
        puVar27[-1] = 0x1d660d;
        operator_delete(psVar4,uVar21);
      }
      psVar4 = local_300;
      if (local_300 != &__str_1._M_string_length) {
        uVar21 = __str_1._M_string_length + 1;
        puVar27[-1] = 0x1d662f;
        operator_delete(psVar4,uVar21);
      }
      puVar27[-1] = 0x1d6649;
      std::istream::read((char *)psVar31,uVar20 * 0x11 + (long)puVar27);
      *(undefined1 *)(lVar29 + uVar20) = 1;
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar26);
  }
  uVar20 = 0;
  if (1 < disk_batches) {
    uVar22 = 1;
    uVar21 = uVar20;
    puVar6 = puVar27;
    do {
      uVar20 = uVar21;
      if ((*(char *)(lVar29 + uVar22) == '\x01') &&
         (puVar5 = (ulong *)((long)puVar27 + uVar21 * 0x11 + 8), uVar20 = uVar22 & 0xffffffff,
         *puVar5 <= *(ulong *)((long)puVar6 + 0x19) &&
         (ulong)(*(ulong *)((long)puVar6 + 0x11) < *(ulong *)((long)puVar27 + uVar21 * 0x11)) <=
         *(ulong *)((long)puVar6 + 0x19) - *puVar5)) {
        uVar20 = uVar21;
      }
      uVar22 = uVar22 + 1;
      uVar21 = uVar20;
      puVar6 = (ulong *)((long)puVar6 + 0x11);
    } while (uVar26 != uVar22);
  }
  local_c8 = *(ulong *)((long)puVar27 + uVar20 * 0x11);
  local_c0 = *(ulong *)((long)puVar27 + uVar20 * 0x11 + 8);
  puVar27[-1] = 0x1d66e3;
  memset(&local_b08,0,0x800);
  uVar11 = __str.field_2._8_8_;
  *(undefined8 *)__str.field_2._8_8_ = 0;
  puVar27[-1] = 0x1d66f8;
  puVar18 = (undefined8 *)operator_new(0x20);
  puVar18[1] = 0x100000001;
  *puVar18 = &PTR___Sp_counted_ptr_inplace_00258c98;
  this_00 = (KmerList *)(puVar18 + 2);
  puVar18[2] = 0;
  puVar18[3] = 0;
  *(undefined8 **)(uVar11 + 8) = puVar18;
  *(KmerList **)uVar11 = this_00;
  uVar30 = 0;
  if (disk_batches == '\0') {
    uVar20 = 0;
    kmerlist = (shared_ptr<KmerList> *)0x0;
  }
  else {
    kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)puVar27 + 0x11);
    kmerlist = (shared_ptr<KmerList> *)0x0;
    uVar20 = 0;
    do {
      uVar21 = 0xffffffff;
      do {
        uVar21 = (ulong)((int)uVar21 + 1);
      } while (*(char *)(lVar29 + uVar21) != '\x01');
      if (disk_batches != '\x01') {
        uVar22 = 1;
        _Var23._M_pi = kmer_list.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        do {
          if (*(char *)(lVar29 + uVar22) == '\x01') {
            puVar6 = (ulong *)((long)puVar27 + uVar21 * 0x11 + 8);
            uVar25 = (uint)uVar22;
            if (*puVar6 <= *(ulong *)&(_Var23._M_pi)->_M_use_count &&
                (ulong)((_Var23._M_pi)->_vptr__Sp_counted_base <
                       *(_func_int ***)((long)puVar27 + uVar21 * 0x11)) <=
                *(ulong *)&(_Var23._M_pi)->_M_use_count - *puVar6) {
              uVar25 = (uint)uVar21;
            }
            uVar21 = (ulong)uVar25;
          }
          uVar22 = uVar22 + 1;
          _Var23._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&_Var23._M_pi[1]._vptr__Sp_counted_base + 1);
        } while (uVar26 != uVar22);
      }
      lVar19 = uVar21 * 0x11;
      puVar6 = (ulong *)(lVar19 + (long)puVar27);
      puVar5 = (ulong *)((long)puVar27 + lVar19 + 8);
      uVar25 = (uint)(uVar20 & 0xff);
      if (local_c0 < *puVar5 ||
          local_c0 - *puVar5 < (ulong)(local_c8 < *(ulong *)((long)puVar27 + lVar19))) {
        hist[(uVar20 & 0xff) - 1] = hist[(uVar20 & 0xff) - 1] + 1;
        if (minCount <= uVar25) {
          psVar8 = (shared_ptr<KmerList> *)puVar18[3];
          if (psVar8 <= kmerlist) {
            puVar27[-1] = 0x1d6842;
            KmerList::resize(this_00,(size_t)(psVar8 + 0x98968));
          }
          pKVar9 = this_00->kmers;
          *(ulong *)((long)&pKVar9[(long)kmerlist].kdata + 8) = local_c0;
          *(ulong *)&pKVar9[(long)kmerlist].kdata = local_c8;
          pKVar9[(long)kmerlist].count = (uint8_t)uVar20;
          kmerlist = (shared_ptr<KmerList> *)
                     ((long)&(kmerlist->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + 1);
        }
        local_c8 = *puVar6;
        local_c0 = puVar6[1];
        uVar25 = (uint)(byte)puVar6[2];
      }
      else {
        uVar25 = (byte)puVar6[2] + uVar25;
        if (0xfe < uVar25) {
          uVar25 = 0xff;
        }
      }
      plVar32 = (long *)(uVar21 * 0x208 + __str_2.field_2._8_8_);
      puVar27[-1] = 0x1d68be;
      std::istream::read((char *)plVar32,(long)puVar6);
      if ((*(byte *)((long)plVar32 + *(long *)(*plVar32 + -0x18) + 0x20) & 2) != 0) {
        *(undefined1 *)(lVar29 + uVar21) = 0;
        uVar30 = uVar30 + 1;
      }
      uVar20 = (ulong)uVar25;
    } while (uVar30 < disk_batches);
  }
  hist[(uVar20 & 0xff) - 1] = hist[(uVar20 & 0xff) - 1] + 1;
  if (minCount <= (uint)(uVar20 & 0xff)) {
    psVar8 = (shared_ptr<KmerList> *)puVar18[3];
    if (psVar8 <= kmerlist) {
      puVar27[-1] = 0x1d6955;
      KmerList::resize(this_00,(size_t)(psVar8 + 0x98968));
    }
    pKVar9 = this_00->kmers;
    *(ulong *)((long)&pKVar9[(long)kmerlist].kdata + 8) = local_c0;
    *(ulong *)&pKVar9[(long)kmerlist].kdata = local_c8;
    pKVar9[(long)kmerlist].count = (uint8_t)uVar20;
    kmerlist = (shared_ptr<KmerList> *)
               ((long)&(kmerlist->super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
               1);
  }
  puVar27[-1] = 0x1d6990;
  KmerList::resize(this_00,(size_t)kmerlist);
  if (disk_batches != '\0') {
    uVar20 = 0;
    do {
      puVar27[-1] = 0x1d69c1;
      std::ifstream::close();
      local_68 = &__str_2._M_string_length;
      pcVar24 = (tmpdir->_M_dataplus)._M_p;
      sVar7 = tmpdir->_M_string_length;
      puVar27[-1] = 0x1d69e2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar24,pcVar24 + sVar7);
      puVar27[-1] = 0x1d69f1;
      std::__cxx11::string::append((char *)&local_68);
      uVar30 = 1;
      if (9 < uVar20) {
        uVar25 = 4;
        uVar21 = uVar20;
        do {
          uVar30 = uVar25;
          uVar15 = (uint)uVar21;
          if (uVar15 < 100) {
            uVar30 = uVar30 - 2;
            goto LAB_001d6a3e;
          }
          if (uVar15 < 1000) {
            uVar30 = uVar30 - 1;
            goto LAB_001d6a3e;
          }
          if (uVar15 < 10000) goto LAB_001d6a3e;
          uVar21 = (uVar21 & 0xffffffff) / 10000;
          uVar25 = uVar30 + 4;
        } while (99999 < uVar15);
        uVar30 = uVar30 + 1;
      }
LAB_001d6a3e:
      local_98 = &__str._M_string_length;
      puVar27[-1] = 0x1d6a5d;
      std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar30);
      psVar4 = local_98;
      puVar27[-1] = 0x1d6a6e;
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)psVar4,uVar30,(uint)uVar20);
      psVar1 = local_68;
      psVar4 = local_98;
      pcVar24 = (pointer)0xf;
      if (local_68 != &__str_2._M_string_length) {
        pcVar24 = (pointer)__str_2._M_string_length;
      }
      if (pcVar24 < __str._M_dataplus._M_p + __str_2._M_dataplus._M_p) {
        pcVar24 = (pointer)0xf;
        if (local_98 != &__str._M_string_length) {
          pcVar24 = (pointer)__str._M_string_length;
        }
        if (pcVar24 < __str._M_dataplus._M_p + __str_2._M_dataplus._M_p) goto LAB_001d6ab3;
        puVar27[-1] = 0x1d6ad4;
        puVar18 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)psVar1);
      }
      else {
LAB_001d6ab3:
        puVar27[-1] = 0x1d6ac2;
        puVar18 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)psVar4);
      }
      psVar4 = puVar18 + 2;
      if ((size_type *)*puVar18 == psVar4) {
        __str_1._M_string_length = *psVar4;
        __str_1.field_2._M_allocated_capacity = puVar18[3];
        local_300 = &__str_1._M_string_length;
      }
      else {
        __str_1._M_string_length = *psVar4;
        local_300 = (size_type *)*puVar18;
      }
      psVar1 = local_300;
      __str_1._M_dataplus._M_p = (pointer)puVar18[1];
      *puVar18 = psVar4;
      puVar18[1] = 0;
      *(undefined1 *)psVar4 = 0;
      puVar27[-1] = 0x1d6b2c;
      remove((char *)psVar1);
      psVar4 = local_300;
      if (local_300 != &__str_1._M_string_length) {
        uVar21 = __str_1._M_string_length + 1;
        puVar27[-1] = 0x1d6b47;
        operator_delete(psVar4,uVar21);
      }
      psVar4 = local_98;
      if (local_98 != &__str._M_string_length) {
        uVar21 = __str._M_string_length + 1;
        puVar27[-1] = 0x1d6b63;
        operator_delete(psVar4,uVar21);
      }
      psVar4 = local_68;
      if (local_68 != &__str_2._M_string_length) {
        uVar21 = __str_2._M_string_length + 1;
        puVar27[-1] = 0x1d6b7c;
        operator_delete(psVar4,uVar21);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar26);
  }
  puVar27[-1] = 0x1d6b95;
  poVar17 = sdglib::OutputLog(INFO,true);
  puVar27[-1] = 0x1d6ba4;
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  puVar27[-1] = 0x1d6bbb;
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"/",1);
  puVar27[-1] = 0x1d6bcd;
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  puVar27[-1] = 0x1d6be4;
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," kmers with Freq >= ",0x14);
  puVar27[-1] = 0x1d6bf2;
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  p_Var10 = poVar17->_vptr_basic_ostream[-3];
  puVar27[-1] = 0x1d6c09;
  std::ios::widen((char)p_Var10 + (char)poVar17);
  puVar27[-1] = 0x1d6c14;
  std::ostream::put((char)poVar17);
  puVar27[-1] = 0x1d6c1c;
  std::ostream::flush();
  puVar27[-1] = 0x1d6c32;
  iVar16 = std::__cxx11::string::compare((char *)workdir);
  uVar11 = __str.field_2._8_8_;
  _Var23._M_pi = extraout_RDX;
  if (iVar16 != 0) {
    pcVar24 = (workdir->_M_dataplus)._M_p;
    sVar7 = workdir->_M_string_length;
    local_68 = &__str_2._M_string_length;
    puVar27[-1] = 0x1d6c5d;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar24,pcVar24 + sVar7);
    puVar27[-1] = 0x1d6c6d;
    std::__cxx11::string::append((char *)&local_68);
    puVar27[-1] = 0x1d6c82;
    std::ofstream::ofstream(&local_300,(string *)&local_68,_S_out);
    psVar4 = local_68;
    if (local_68 != &__str_2._M_string_length) {
      puVar27[-1] = 0x1d6c97;
      operator_delete(psVar4,__str_2._M_string_length + 1);
    }
    lVar19 = 1;
    do {
      puVar27[-1] = 0x1d6cb5;
      poVar17 = (ostream *)std::ostream::operator<<(&local_300,(int)lVar19);
      puVar27[-1] = 0x1d6cc8;
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
      puVar27[-1] = 0x1d6cd8;
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      p_Var10 = poVar17->_vptr_basic_ostream[-3];
      puVar27[-1] = 0x1d6cef;
      std::ios::widen((char)p_Var10 + (char)poVar17);
      puVar27[-1] = 0x1d6cfa;
      std::ostream::put((char)poVar17);
      puVar27[-1] = 0x1d6d02;
      std::ostream::flush();
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x100);
    puVar27[-1] = 0x1d6d1a;
    std::ofstream::close();
    local_300 = _VTT;
    *(undefined8 *)((long)&local_300 + _VTT[-3]) = _setbuf;
    puVar27[-1] = 0x1d6d44;
    std::filebuf::~filebuf((filebuf *)&__str_1);
    puVar27[-1] = 0x1d6d50;
    std::ios_base::~ios_base(local_208);
    _Var23._M_pi = extraout_RDX_00;
  }
  if (disk_batches != '\0') {
    lVar29 = __str_2.field_2._8_8_ + -0x208;
    lVar19 = (ulong)disk_batches * 0x200 + uVar26 * 8;
    do {
      puVar27[-1] = 0x1d6d74;
      std::ifstream::~ifstream((void *)(lVar29 + lVar19));
      lVar19 = lVar19 + -0x208;
      _Var23._M_pi = extraout_RDX_01;
    } while (lVar19 != 0);
  }
  sVar33.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var23._M_pi;
  sVar33.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar11;
  return (shared_ptr<KmerList>)sVar33.super___shared_ptr<KmerList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<KmerList>
BatchKmersCounter::kmerCountOMPDiskBased(uint8_t K, LongReadsDatastore const &reads,
                                         unsigned minCount, std::string tmpdir, std::string workdir,
                                         unsigned char disk_batches) {

    //If size larger than batch (or still not enough cpus used, or whatever), Lauch 2 tasks to sort the 2 halves, with minFreq=0

    sdglib::OutputLog() << "disk-based kmer counting with "<<(int) disk_batches<<" batches"<<std::endl;
    uint64_t total_kmers_in_batches=0;
    for (auto batch=0;batch < disk_batches;batch++) {
        uint64_t to = (batch+1) * reads.size()/disk_batches;
        uint64_t from= batch * reads.size()/disk_batches;
        auto kmer_list = kmerCountOMP(K, reads,from,to);
        std::ofstream batch_file(tmpdir+"/kmer_count_batch_"+std::to_string((int)batch),std::ios::out | std::ios::trunc | std::ios::binary);
        batch_file.write((const char *)kmer_list->kmers,sizeof(KMerNodeFreq_s)*kmer_list->size);
        batch_file.close();
        sdglib::OutputLog() << "batch "<<(int) batch<<" done and dumped with "<<kmer_list->size<< " kmers" <<std::endl;
        total_kmers_in_batches+=kmer_list->size;
    }

    //now a multi-merge sort between all batch files into the Dict
    sdglib::OutputLog() << "merging from disk"<<std::endl;
    //open all batch files
    std::ifstream dbf[disk_batches];
    bool dbf_active[disk_batches];
    KMerNodeFreq_s next_knf_from_dbf[disk_batches];
    uint finished_files=0;
    for (auto i=0;i<disk_batches;i++){
        dbf[i].open(tmpdir+"/kmer_count_batch_"+std::to_string((int)i),std::ios::in | std::ios::binary);
        dbf[i].read((char *)&next_knf_from_dbf[i],sizeof(KMerNodeFreq_s));
        dbf_active[i]=true;
    }
    //set all finished flags to false
    //TODO: stupid minimum search
    KMerNodeFreq_s current_kmer;
    //while finished_files<batches
    bool first=true;
    uint min=0;
    for (auto i=1;i<disk_batches;++i)
        if (dbf_active[i]){
            if (next_knf_from_dbf[i]<next_knf_from_dbf[min]) min=i;
        }
    current_kmer=next_knf_from_dbf[min];
    current_kmer.count=0;
    uint64_t used = 0,not_used=0;
    uint64_t hist[256];
    for (auto &h:hist) h=0;
    std::shared_ptr<KmerList> kmerlist=std::make_shared<KmerList>();
    //size_t last_kmer=0;
    size_t alloc_block=10000000;
    while (finished_files<disk_batches) {
        //find minimum of the non-finished files
        uint min=0;
        while (!dbf_active[min])++min;
        for (auto i=1;i<disk_batches;++i)
            if (dbf_active[i]){
                if (next_knf_from_dbf[i]<next_knf_from_dbf[min]) min=i;
            }
        //larger than current kmer?
        if (next_knf_from_dbf[min] > current_kmer) {
            ++hist[std::min(255,(int)current_kmer.count)];
            if (current_kmer.count>=minCount) {
                //(*dict)->insertEntryNoLocking(BRQ_Entry((BRQ_Kmer) current_kmer, current_kmer.kc));
                //kmerlist.push_back(current_kmer);
                if (used>=kmerlist->size) kmerlist->resize(kmerlist->size+alloc_block);
                kmerlist->kmers[used]=current_kmer;
                ++used;
            }
            else ++not_used;
            current_kmer=next_knf_from_dbf[min];
        } else {
            current_kmer.combine(next_knf_from_dbf[min]);
        }
        //advance min file
        dbf[min].read((char *)&next_knf_from_dbf[min],sizeof(KMerNodeFreq_s));
        if ( dbf[min].eof() ) {
            dbf_active[min]=false;
            ++finished_files;
        }
    }

    ++hist[(int)current_kmer.count];
    if (current_kmer.count>=minCount) {
        //kmerlist.push_back(current_kmer);
        if (used>=kmerlist->size) kmerlist->resize(kmerlist->size+alloc_block);
        kmerlist->kmers[used]=current_kmer;
        used++;
    }
    else not_used++;
    kmerlist->resize(used);
    for (auto i=0;i<disk_batches;i++) {
        dbf[i].close();
        std::remove((tmpdir + "/kmer_count_batch_" +std::to_string((int)i)).c_str());
    }
    sdglib::OutputLog()<< used << "/" << used+not_used << " kmers with Freq >= " << minCount << std::endl;
    if (""!=workdir) {
        std::ofstream kff(workdir + "/small_K.freqs");
        for (auto i = 1; i < 256; i++) kff << i << ", " << hist[i] << std::endl;
        kff.close();
    }
    return kmerlist;
}